

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.h
# Opt level: O1

void haarXY(integral_image *iimage,int row,int col,int scale,float *haarX,float *haarY)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  int iVar7;
  int _b_1;
  int iVar8;
  int iVar9;
  int _b;
  int iVar10;
  int iVar11;
  int iVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  iVar1 = iimage->width;
  iVar2 = iimage->height;
  iVar9 = row + scale * 2;
  iVar11 = row;
  if (iVar2 < row) {
    iVar11 = iVar2;
  }
  iVar12 = iVar11 + -1;
  iVar8 = col + scale * 2;
  iVar5 = col;
  if (iVar1 < col) {
    iVar5 = iVar1;
  }
  iVar10 = iVar5 + -1;
  iVar6 = scale + row;
  if (iVar2 <= scale + row) {
    iVar6 = iVar2;
  }
  iVar7 = scale + col;
  if (iVar1 <= scale + col) {
    iVar7 = iVar1;
  }
  if (iVar9 < iVar2) {
    iVar2 = iVar9;
  }
  if (iVar8 < iVar1) {
    iVar1 = iVar8;
  }
  pfVar3 = iimage->data;
  iVar9 = iimage->data_width;
  fVar13 = 0.0;
  fVar14 = 0.0;
  if (0 < iVar5 && 0 < iVar11) {
    fVar14 = pfVar3[iVar12 * iVar9 + iVar10];
  }
  if (0 < iVar7 && 0 < iVar11) {
    fVar13 = pfVar3[iVar12 * iVar9 + iVar7 + -1];
  }
  iVar8 = iVar1 + -1;
  fVar15 = 0.0;
  fVar16 = 0.0;
  if (0 < iVar1 && 0 < iVar11) {
    fVar16 = pfVar3[iVar12 * iVar9 + iVar8];
  }
  if (0 < iVar6 && 0 < iVar5) {
    fVar15 = pfVar3[(iVar6 + -1) * iVar9 + iVar10];
  }
  fVar18 = 0.0;
  fVar17 = 0.0;
  if (0 < iVar1 && 0 < iVar6) {
    fVar17 = pfVar3[(iVar6 + -1) * iVar9 + iVar8];
  }
  iVar11 = iVar2 + -1;
  if (0 < iVar2 && 0 < iVar5) {
    fVar18 = pfVar3[iVar11 * iVar9 + iVar10];
  }
  fVar20 = 0.0;
  fVar19 = 0.0;
  if (0 < iVar7 && 0 < iVar2) {
    fVar19 = pfVar3[iVar11 * iVar9 + iVar7 + -1];
  }
  if (0 < iVar1 && 0 < iVar2) {
    fVar20 = pfVar3[iVar11 * iVar9 + iVar8];
  }
  auVar4 = vfmadd213ss_fma(ZEXT416((uint)(fVar13 - fVar19)),SUB6416(ZEXT464(0x40000000),0),
                           ZEXT416((uint)(fVar20 - fVar14)));
  *haarX = (fVar18 - fVar16) + auVar4._0_4_;
  auVar4 = vfmadd213ss_fma(ZEXT416((uint)(fVar15 - fVar17)),SUB6416(ZEXT464(0x40000000),0),
                           ZEXT416((uint)(fVar20 - fVar14)));
  *haarY = auVar4._0_4_ - (fVar18 - fVar16);
  return;
}

Assistant:

inline void haarXY(struct integral_image *iimage, int row, int col, int scale, float* haarX, float* haarY) {
    
    // TODO: (Sebastian) fix for iimage with padding
    int width = iimage->width;
    int height = iimage->height;

    // subtracting by one for row/col because row/col is inclusive.
    int r0 = MIN(row, height) - 1;         
    int c0 = MIN(col, width) - 1;         
    int r1 = MIN(row + scale, height) - 1;  
    int c1 = MIN(col + scale, width) - 1;   
    int r2 = MIN(row + 2*scale, height) - 1;
    int c2 = MIN(col + 2*scale, width) - 1;

    float r0c0 = 0.0f; // A
    float r0c1 = 0.0f; // B
    float r0c2 = 0.0f; // C
    float r1c0 = 0.0f; // D
    float r1c2 = 0.0f; // E
    float r2c0 = 0.0f; // F
    float r2c1 = 0.0f; // G
    float r2c2 = 0.0f; // H

    float *data = iimage->data;
    int data_width = iimage->data_width;

    if (r0 >= 0 && c0 >= 0)  {
        r0c0 = data[r0 * data_width + c0];
    }
    if (r0 >= 0 && c1 >= 0) {
        r0c1 = data[r0 * data_width + c1];
    }
    if (r0 >= 0 && c2 >= 0) {
        r0c2 = data[r0 * data_width + c2];
    }
    if (r1 >= 0 && c0 >= 0) {
        r1c0 = data[r1 * data_width + c0];
    }
    if (r1 >= 0 && c2 >= 0) {
        r1c2 = data[r1 * data_width + c2];
    }
    if (r2 >= 0 && c0 >= 0) {
        r2c0 = data[r2 * data_width + c0];
    }
    if (r2 >= 0 && c1 >= 0) {
        r2c1 = data[r2 * data_width + c1];
    }
    if (r2 >= 0 && c2 >= 0) {
        r2c2 = data[r2 * data_width + c2];
    }


    // *haarX = (r0c1 - r0c2 - r2c1 + r2c2) - (r0c0 - r0c1 - r2c0 + r2c1);
    // *haarY = (r1c0 - r1c2 - r2c0 + r2c2) - (r0c0 - r0c2 - r1c0 + r1c2);

    float r2c2_sub_r0c0 = r2c2 - r0c0;
    float r2c0_sub_r0c2 = r2c0 - r0c2;

    *haarX = 2*(r0c1 - r2c1) + r2c2_sub_r0c0 + r2c0_sub_r0c2;
    *haarY = 2*(r1c0 - r1c2) + r2c2_sub_r0c0 - r2c0_sub_r0c2;

    // for FMA
    // *haarX = (2*r0c1 + r2c0_sub_r0c2) - (2*r2c1 - r2c2_sub_r0c0);
    // *haarY = (2*r1c0 - r2c0_sub_r0c2) - (2*r1c2 - r2c2_sub_r0c0);
}